

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O3

bool __thiscall cmArchiveWrite::AddFile(cmArchiveWrite *this,char *file,size_t skip,char *prefix)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  ostream *poVar6;
  archive_entry *entry;
  time_t t;
  char *pcVar7;
  size_t size;
  time_t now;
  string dest;
  allocator local_99;
  wstring local_98;
  char *local_78;
  string local_70;
  string local_50;
  
  sVar5 = strlen(file);
  if (sVar5 <= skip) {
    return true;
  }
  local_78 = setlocale(0,(char *)0x0);
  setlocale(0,"");
  if (prefix == (char *)0x0) {
    prefix = "";
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  sVar5 = strlen(prefix);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,prefix,prefix + sVar5);
  std::__cxx11::string::append((char *)&local_70);
  if (this->Verbose == true) {
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_70._M_dataplus._M_p,local_70._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  }
  entry = archive_entry_new();
  std::__cxx11::string::string((string *)&local_50,file,&local_99);
  cmsys::Encoding::ToWide(&local_98,&local_50);
  archive_entry_copy_sourcepath_w(entry,local_98._M_dataplus._M_p);
  paVar2 = &local_98.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_98._M_dataplus._M_p != paVar2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  cmsys::Encoding::ToWide(&local_98,&local_70);
  archive_entry_copy_pathname_w(entry,local_98._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_98._M_dataplus._M_p != paVar2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity * 4 + 4);
  }
  iVar4 = archive_read_disk_entry_from_file(this->Disk,entry,-1,(stat *)0x0);
  if (iVar4 == 0) {
    if ((this->MTime)._M_string_length == 0) {
LAB_0025f2e3:
      archive_entry_acl_clear(entry);
      archive_entry_xattr_clear(entry);
      archive_entry_set_fflags(entry,0,0);
      iVar4 = archive_write_header(this->Archive,entry);
      if (iVar4 == 0) {
        pcVar7 = archive_entry_symlink(entry);
        bVar3 = true;
        if ((pcVar7 == (char *)0x0) && (size = archive_entry_size(entry), size != 0)) {
          bVar3 = AddData(this,file,size);
        }
        goto LAB_0025f36b;
      }
      std::__cxx11::string::_M_replace
                ((ulong)&this->Error,0,(char *)(this->Error)._M_string_length,0x4b2add);
      cm_archive_error_string_abi_cxx11_((string *)&local_98,this->Archive);
      std::__cxx11::string::_M_append((char *)&this->Error,(ulong)local_98._M_dataplus._M_p);
      goto LAB_0025f352;
    }
    time((time_t *)&local_98);
    t = cm_get_date((time_t)local_98._M_dataplus._M_p,(this->MTime)._M_dataplus._M_p);
    if (t != -1) {
      archive_entry_set_mtime(entry,t,0);
      goto LAB_0025f2e3;
    }
    psVar1 = &this->Error;
    std::__cxx11::string::_M_replace
              ((ulong)psVar1,0,(char *)(this->Error)._M_string_length,0x4b2ac5);
    std::__cxx11::string::_M_append((char *)psVar1,(ulong)(this->MTime)._M_dataplus._M_p);
    std::__cxx11::string::append((char *)psVar1);
  }
  else {
    psVar1 = &this->Error;
    std::__cxx11::string::_M_replace
              ((ulong)psVar1,0,(char *)(this->Error)._M_string_length,0x4b2aa1);
    std::__cxx11::string::append((char *)psVar1);
    std::__cxx11::string::append((char *)psVar1);
    cm_archive_error_string_abi_cxx11_((string *)&local_98,this->Disk);
    std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_98._M_dataplus._M_p);
LAB_0025f352:
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_98._M_dataplus._M_p != paVar2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  bVar3 = false;
LAB_0025f36b:
  archive_entry_free(entry);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  setlocale(0,local_78);
  return bVar3;
}

Assistant:

bool cmArchiveWrite::AddFile(const char* file,
                             size_t skip, const char* prefix)
{
  // Skip the file if we have no name for it.  This may happen on a
  // top-level directory, which does not need to be included anyway.
  if(skip >= strlen(file))
    {
    return true;
    }
  const char* out = file + skip;

  cmLocaleRAII localeRAII;
  static_cast<void>(localeRAII);

  // Meta-data.
  std::string dest = prefix? prefix : "";
  dest += out;
  if(this->Verbose)
    {
    std::cout << dest << "\n";
    }
  Entry e;
  cm_archive_entry_copy_sourcepath(e, file);
  cm_archive_entry_copy_pathname(e, dest);
  if(archive_read_disk_entry_from_file(this->Disk, e, -1, 0) != ARCHIVE_OK)
    {
    this->Error = "archive_read_disk_entry_from_file '";
    this->Error += file;
    this->Error += "': ";
    this->Error += cm_archive_error_string(this->Disk);
    return false;
    }
  if (!this->MTime.empty())
    {
    time_t now;
    time(&now);
    time_t t = cm_get_date(now, this->MTime.c_str());
    if (t == -1)
      {
      this->Error = "unable to parse mtime '";
      this->Error += this->MTime;
      this->Error += "'";
      return false;
      }
    archive_entry_set_mtime(e, t, 0);
    }
  // Clear acl and xattr fields not useful for distribution.
  archive_entry_acl_clear(e);
  archive_entry_xattr_clear(e);
  archive_entry_set_fflags(e, 0, 0);
  if(archive_write_header(this->Archive, e) != ARCHIVE_OK)
    {
    this->Error = "archive_write_header: ";
    this->Error += cm_archive_error_string(this->Archive);
    return false;
    }

  // do not copy content of symlink
  if (!archive_entry_symlink(e))
    {
    // Content.
    if(size_t size = static_cast<size_t>(archive_entry_size(e)))
      {
      return this->AddData(file, size);
      }
    }
  return true;
}